

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcols.c
# Opt level: O0

int ffpcns(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          char **array,char *nulvalue,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  char *in_stack_00000008;
  LONGLONG fstrow;
  LONGLONG fstelm;
  LONGLONG first;
  LONGLONG ii;
  LONGLONG nbad;
  LONGLONG ngood;
  long width;
  long repeat;
  int *in_stack_00000080;
  fitsfile *in_stack_00000088;
  int *in_stack_000001a0;
  LONGLONG in_stack_000001a8;
  LONGLONG in_stack_000001b0;
  LONGLONG in_stack_000001b8;
  int in_stack_000001c4;
  fitsfile *in_stack_000001c8;
  char **in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  LONGLONG in_stack_00007248;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  int *in_stack_000072a0;
  int *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff88;
  long *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  long lVar3;
  fitsfile *fptr_00;
  long local_50;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_50 = 0;
  fptr_00 = (fitsfile *)0x0;
  if (*(int *)fstrow < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_00000088,in_stack_00000080), 0 < iVar1)) {
        return *(int *)fstrow;
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (int)((ulong)in_RDI >> 0x20),(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    }
    ffgtcl(fptr_00,iVar2,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
           in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    for (lVar3 = 0; lVar3 < in_R8; lVar3 = lVar3 + 1) {
      iVar2 = strcmp(in_stack_00000008,*(char **)(in_R9 + lVar3 * 8));
      if (iVar2 == 0) {
        if (local_50 != 0) {
          iVar2 = ffpcls(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,
                         in_stack_00007238,in_stack_00007230,in_stack_000072a0);
          if (0 < iVar2) {
            return *(int *)fstrow;
          }
          local_50 = 0;
        }
        fptr_00 = (fitsfile *)((long)&fptr_00->HDUposition + 1);
      }
      else {
        if (fptr_00 != (fitsfile *)0x0) {
          iVar2 = ffpclu(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,in_stack_000001b0,
                         in_stack_000001a8,in_stack_000001a0);
          if (0 < iVar2) {
            return *(int *)fstrow;
          }
          fptr_00 = (fitsfile *)0x0;
        }
        local_50 = local_50 + 1;
      }
    }
    if (local_50 == 0) {
      if (fptr_00 != (fitsfile *)0x0) {
        ffpclu(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,in_stack_000001b0,
               in_stack_000001a8,in_stack_000001a0);
      }
    }
    else {
      ffpcls(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,
             in_stack_00007238,in_stack_00007230,in_stack_000072a0);
    }
    iVar2 = *(int *)fstrow;
  }
  else {
    iVar2 = *(int *)fstrow;
  }
  return iVar2;
}

Assistant:

int ffpcns( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char  **array,   /* I - array of values to write                */
            char  *nulvalue, /* I - string representing a null value        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels flagged as null will be replaced by the appropriate
  null value in the output FITS file. 
*/
{
    long repeat, width;
    LONGLONG ngood = 0, nbad = 0, ii;
    LONGLONG first, fstelm, fstrow;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    /* get the vector repeat length of the column */
    ffgtcl(fptr, colnum, NULL, &repeat, &width, status);

    if ((fptr->Fptr)->hdutype == BINARY_TBL)
        repeat = repeat / width;    /* convert from chars to unit strings */

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (strcmp(nulvalue, array[ii]))  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);
            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0)
                return(*status);

            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    return(*status);
}